

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::TJHexLow
          (AbstractContentContext *this,StringOrDoubleList *inStringsAndSpacing)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var3;
  string local_40;
  
  p_Var3 = (inStringsAndSpacing->
           super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var_00,iVar2),&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::StartArray(this_00);
  for (; p_Var3 != (_List_node_base *)inStringsAndSpacing;
      p_Var3 = (((_List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (*(char *)&p_Var3[3]._M_prev == '\x01') {
      PrimitiveObjectsWriter::WriteDouble(this_00,(double)p_Var3[3]._M_next,eTokenSeparatorSpace);
    }
    else {
      PrimitiveObjectsWriter::WriteHexString(this_00,(string *)(p_Var3 + 1),eTokenSeparatorSpace);
    }
  }
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorSpace);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TJ","");
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::TJHexLow(const StringOrDoubleList& inStringsAndSpacing)
{
	StringOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.StartArray();

	for(; it != inStringsAndSpacing.end();++it)
	{
		if(it->IsDouble)
			mPrimitiveWriter.WriteDouble(it->DoubleValue);
		else
			mPrimitiveWriter.WriteHexString(it->SomeValue);
	}
	
	mPrimitiveWriter.EndArray(eTokenSeparatorSpace);

	mPrimitiveWriter.WriteKeyword("TJ");
	return GetCurrentStatusCode();
}